

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  conncache *connc;
  Curl_easy *pCVar1;
  Curl_easy *pCVar2;
  Curl_easy *pCVar3;
  connectdata *conn;
  CURLMcode CVar4;
  sigpipe_ignore pipe_st;
  sigpipe_ignore sStack_c8;
  
  CVar4 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    multi->type = 0;
    connc = &multi->conn_cache;
    conn = Curl_conncache_find_first_connection(connc);
    while (conn != (connectdata *)0x0) {
      pCVar1 = multi->closure_handle;
      conn->data = pCVar1;
      sigpipe_ignore(pCVar1,&sStack_c8);
      conn->data->easy_conn = (connectdata *)0x0;
      Curl_conncontrol(conn,1);
      Curl_disconnect(conn,false);
      if (sStack_c8.no_signal == false) {
        sigaction(0xd,(sigaction *)&sStack_c8,(sigaction *)0x0);
      }
      conn = Curl_conncache_find_first_connection(connc);
    }
    pCVar1 = multi->closure_handle;
    if (pCVar1 != (Curl_easy *)0x0) {
      sigpipe_ignore(pCVar1,&sStack_c8);
      pCVar2 = multi->closure_handle;
      (pCVar2->dns).hostcache = &multi->hostcache;
      Curl_hostcache_clean(pCVar2,&multi->hostcache);
      Curl_close(multi->closure_handle);
    }
    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(connc);
    Curl_llist_destroy(&multi->msglist,(void *)0x0);
    Curl_llist_destroy(&multi->pending,(void *)0x0);
    pCVar2 = multi->easyp;
    while (pCVar2 != (Curl_easy *)0x0) {
      pCVar3 = pCVar2->next;
      if ((pCVar2->dns).hostcachetype == HCACHE_MULTI) {
        Curl_hostcache_clean(pCVar2,(pCVar2->dns).hostcache);
        (pCVar2->dns).hostcache = (curl_hash *)0x0;
        (pCVar2->dns).hostcachetype = HCACHE_NONE;
      }
      (pCVar2->state).conn_cache = (conncache *)0x0;
      pCVar2->multi = (Curl_multi *)0x0;
      pCVar2 = pCVar3;
    }
    Curl_hash_destroy(&multi->hostcache);
    Curl_pipeline_set_site_blacklist((char **)0x0,&multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist((char **)0x0,&multi->pipelining_server_bl);
    (*Curl_cfree)(multi);
    CVar4 = CURLM_OK;
    if ((pCVar1 != (Curl_easy *)0x0) && (CVar4 = CURLM_OK, sStack_c8.no_signal == false)) {
      sigaction(0xd,(sigaction *)&sStack_c8,(sigaction *)0x0);
    }
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  struct Curl_easy *data;
  struct Curl_easy *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    bool restore_pipe = FALSE;
    SIGPIPE_VARIABLE(pipe_st);

    multi->type = 0; /* not good anymore */

    /* Close all the connections in the connection cache */
    close_all_connections(multi);

    if(multi->closure_handle) {
      sigpipe_ignore(multi->closure_handle, &pipe_st);
      restore_pipe = TRUE;

      multi->closure_handle->dns.hostcache = &multi->hostcache;
      Curl_hostcache_clean(multi->closure_handle,
                           multi->closure_handle->dns.hostcache);

      Curl_close(multi->closure_handle);
    }

    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist, NULL);
    Curl_llist_destroy(&multi->pending, NULL);

    /* remove all easy handles */
    data = multi->easyp;
    while(data) {
      nextdata=data->next;
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

      data = nextdata;
    }

    Curl_hash_destroy(&multi->hostcache);

    /* Free the blacklists by setting them to NULL */
    Curl_pipeline_set_site_blacklist(NULL, &multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist(NULL, &multi->pipelining_server_bl);

    free(multi);
    if(restore_pipe)
      sigpipe_restore(&pipe_st);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}